

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.h
# Opt level: O3

void anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  string name;
  is_new_style_constructor local_61;
  class_<anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>,_anurbs::SurfaceBase<3L>,_std::shared_ptr<anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>_>_>
  local_60;
  long *local_58;
  long local_48 [2];
  code *local_38;
  undefined8 local_30;
  arg local_28;
  
  python_name_abi_cxx11_();
  pybind11::
  class_<anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>,_anurbs::SurfaceBase<3L>,_std::shared_ptr<anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>_>_>
  ::class_<>(&local_60,(m->super_object).super_handle.m_ptr,(char *)local_58);
  local_28.name = "geometry";
  local_28._8_1_ = 2;
  pybind11::
  class_<anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>,_anurbs::SurfaceBase<3L>,_std::shared_ptr<anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>_>_>
  ::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oberbichler[P]ANurbs_external_libraries_pybind11_include_pybind11_detail_init_h:173:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg>
            (&local_60,"__init__",(type *)&local_38,&local_61,&local_28);
  local_38 = Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>::surface_geometry;
  local_30 = 0;
  pybind11::
  class_<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>>
  ::
  def<anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>(anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>::*)()const>
            ((class_<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>>
              *)&local_60,"surface_geometry",(offset_in_Model_to_subr *)&local_38);
  pybind11::object::~object((object *)&local_60);
  Model::
  register_python_data_type<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>>
            (m,model);
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel& model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = Surface<TDimension, TRef>;
        using Base = SurfaceBase<TDimension>;
        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Base, Holder>(m, name.c_str())
            .def(py::init<TRef>(), "geometry"_a)
            .def("surface_geometry", &Type::surface_geometry)
        ;

        Model::register_python_data_type<Type>(m, model);
    }